

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void cppwinrt::get_interfaces_impl
               (writer *w,get_interfaces_t *result,bool defaulted,bool overridable,bool base,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *generic_param_stack,
               pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *children)

{
  byte bVar1;
  byte bVar2;
  pointer pvVar3;
  bool bVar4;
  TypeDefOrRef TVar5;
  InterfaceImpl *pIVar6;
  GenericTypeInstSig *pGVar7;
  __normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
  *p_Var8;
  coded_index<winmd::reader::TypeDefOrRef> cVar9;
  string_view sVar10;
  TypeRef TVar11;
  TypeSpec TVar12;
  TypeDef TVar13;
  bool local_3b1;
  bool local_39a;
  bool local_399;
  string_view local_358;
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> local_348;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  basic_string_view<char,_std::char_traits<char>_> local_318;
  table_base *local_308;
  uint32_t local_300;
  table_base *local_2f8;
  uint32_t local_2f0;
  coded_index<winmd::reader::TypeDefOrRef> local_2e8;
  table_base *local_2d8;
  uint32_t local_2d0;
  undefined1 local_2c8 [8];
  GenericTypeInstSig signature;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  string local_278;
  TypeSig *local_258;
  TypeSig *arg;
  __normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
  __end4;
  __normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
  __begin4;
  pair<__gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  TypeSpec local_200;
  undefined1 local_1f0 [8];
  TypeSpecSig type_signature;
  TypeRef local_198;
  pointer local_188;
  uint32_t local_180;
  table_base *local_178;
  uint32_t local_170;
  table_base *local_168;
  uint32_t local_160;
  generic_param_guard local_158;
  generic_param_guard guard;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  undefined4 local_12c;
  string_view local_128;
  interface_info *local_118;
  interface_info *found;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined1 local_e0 [8];
  string name;
  undefined1 local_a0 [8];
  coded_index<winmd::reader::TypeDefOrRef> type;
  interface_info info;
  value_type *impl;
  InterfaceImpl __end1;
  InterfaceImpl __begin1;
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *__range1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *generic_param_stack_local;
  bool base_local;
  bool overridable_local;
  bool defaulted_local;
  get_interfaces_t *result_local;
  writer *w_local;
  
  pIVar6 = winmd::reader::begin<winmd::reader::InterfaceImpl>(children);
  __end1.super_row_base<winmd::reader::InterfaceImpl>._8_8_ =
       (pIVar6->super_row_base<winmd::reader::InterfaceImpl>).m_table;
  pIVar6 = winmd::reader::end<winmd::reader::InterfaceImpl>(children);
  impl = (value_type *)(pIVar6->super_row_base<winmd::reader::InterfaceImpl>).m_table;
  __end1.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       *(table_base **)&(pIVar6->super_row_base<winmd::reader::InterfaceImpl>).m_index;
  while( true ) {
    bVar4 = winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator!=
                      ((row_base<winmd::reader::InterfaceImpl> *)
                       &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index,
                       (row_base<winmd::reader::InterfaceImpl> *)&impl);
    if (!bVar4) break;
    info.generic_param_stack.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator*
                            ((row_base<winmd::reader::InterfaceImpl> *)
                             &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index);
    interface_info::interface_info
              ((interface_info *)
               &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                super_index_base<winmd::reader::TypeDefOrRef>.m_value);
    cVar9 = winmd::reader::InterfaceImpl::Interface
                      ((InterfaceImpl *)
                       info.generic_param_stack.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    name.field_2._8_8_ =
         cVar9.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table._0_4_ =
         cVar9.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    local_a0 = (undefined1  [8])name.field_2._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,"%");
    writer_base<cppwinrt::writer>::
    write_temp<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
              ((string *)local_e0,&w->super_writer_base<cppwinrt::writer>,&local_f0,
               (coded_index<winmd::reader::TypeDefOrRef> *)local_a0);
    pvVar3 = info.generic_param_stack.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_100,"Windows.Foundation.Metadata");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&found,"DefaultAttribute");
    info.type.super_row_base<winmd::reader::TypeDef>.m_index._0_1_ =
         has_attribute<winmd::reader::InterfaceImpl>
                   ((InterfaceImpl *)pvVar3,&local_100,
                    (basic_string_view<char,_std::char_traits<char>_> *)&found);
    local_399 = false;
    if (!base) {
      local_39a = true;
      if (!defaulted) {
        local_39a = (bool)(undefined1)info.type.super_row_base<winmd::reader::TypeDef>.m_index;
      }
      local_399 = local_39a;
    }
    info.type.super_row_base<winmd::reader::TypeDef>.m_index._1_1_ = local_399;
    sVar10 = (string_view)
             ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
    local_128 = sVar10;
    local_118 = find(result,&local_128);
    pvVar3 = info.generic_param_stack.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((local_118 == (interface_info *)0x0) ||
       (((local_118->defaulted & 1U) == 0 &&
        ((info.type.super_row_base<winmd::reader::TypeDef>.m_index._1_1_ & 1) != 0)))) {
      local_3b1 = true;
      if (!overridable) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_140,"Windows.Foundation.Metadata");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&guard,"OverridableAttribute"
                  );
        local_3b1 = has_attribute<winmd::reader::InterfaceImpl>
                              ((InterfaceImpl *)pvVar3,&local_140,
                               (basic_string_view<char,_std::char_traits<char>_> *)&guard);
      }
      info.type.super_row_base<winmd::reader::TypeDef>.m_index._2_1_ = local_3b1;
      info.type.super_row_base<winmd::reader::TypeDef>.m_index._3_1_ = base;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator=((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&info.relative_version,generic_param_stack);
      writer::generic_param_guard::generic_param_guard(&local_158,(writer *)0x0);
      TVar5 = winmd::reader::index_base<winmd::reader::TypeDefOrRef>::type
                        ((index_base<winmd::reader::TypeDefOrRef> *)local_a0);
      if (TVar5 == TypeDef) {
        TVar13 = winmd::reader::typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                           ((typed_index<winmd::reader::TypeDefOrRef> *)local_a0);
        local_178 = TVar13.super_row_base<winmd::reader::TypeDef>.m_table;
        local_170 = TVar13.super_row_base<winmd::reader::TypeDef>.m_index;
        local_168 = local_178;
        local_160 = local_170;
        type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>._8_8_ = local_178;
        info.type.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ = local_170;
      }
      else if (TVar5 == TypeRef) {
        TVar11 = winmd::reader::typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                           ((typed_index<winmd::reader::TypeDefOrRef> *)local_a0);
        local_198.super_row_base<winmd::reader::TypeRef>.m_table =
             TVar11.super_row_base<winmd::reader::TypeRef>.m_table;
        local_198.super_row_base<winmd::reader::TypeRef>.m_index =
             TVar11.super_row_base<winmd::reader::TypeRef>.m_index;
        TVar13 = winmd::reader::find_required(&local_198);
        type_signature.m_type.m_generic_args.
        super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)TVar13.super_row_base<winmd::reader::TypeDef>.m_table;
        local_180 = TVar13.super_row_base<winmd::reader::TypeDef>.m_index;
        local_188 = type_signature.m_type.m_generic_args.
                    super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>._8_8_ =
             type_signature.m_type.m_generic_args.
             super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        info.type.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ = local_180;
        writer::add_depends(w,(TypeDef *)
                              &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                               super_index_base<winmd::reader::TypeDefOrRef>.m_value);
      }
      else if (TVar5 == TypeSpec) {
        TVar12 = winmd::reader::typed_index<winmd::reader::TypeDefOrRef>::TypeSpec
                           ((typed_index<winmd::reader::TypeDefOrRef> *)local_a0);
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)TVar12.super_row_base<winmd::reader::TypeSpec>.m_table;
        local_200.super_row_base<winmd::reader::TypeSpec>.m_index =
             TVar12.super_row_base<winmd::reader::TypeSpec>.m_index;
        local_200.super_row_base<winmd::reader::TypeSpec>.m_table =
             (table_base *)
             names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        winmd::reader::TypeSpec::Signature((TypeSpecSig *)local_1f0,&local_200);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range4);
        pGVar7 = winmd::reader::TypeSpecSig::GenericTypeInst((TypeSpecSig *)local_1f0);
        ___begin4 = winmd::reader::GenericTypeInstSig::GenericArgs(pGVar7);
        p_Var8 = winmd::reader::
                 begin<__gnu_cxx::__normal_iterator<winmd::reader::TypeSig_const*,std::vector<winmd::reader::TypeSig,std::allocator<winmd::reader::TypeSig>>>>
                           ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>_>
                             *)&__begin4);
        __end4._M_current = p_Var8->_M_current;
        p_Var8 = winmd::reader::
                 end<__gnu_cxx::__normal_iterator<winmd::reader::TypeSig_const*,std::vector<winmd::reader::TypeSig,std::allocator<winmd::reader::TypeSig>>>>
                           ((pair<__gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>_>
                             *)&__begin4);
        arg = p_Var8->_M_current;
        while( true ) {
          bVar4 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
                                      *)&arg);
          if (!bVar4) break;
          local_258 = __gnu_cxx::
                      __normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
                      ::operator*(&__end4);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,"%");
          writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
                    (&local_278,&w->super_writer_base<cppwinrt::writer>,&local_288,local_258);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range4,&local_278);
          ::std::__cxx11::string::~string((string *)&local_278);
          __gnu_cxx::
          __normal_iterator<const_winmd::reader::TypeSig_*,_std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>_>
          ::operator++(&__end4);
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&info.relative_version,(value_type *)&__range4);
        winmd::reader::TypeSpecSig::GenericTypeInst((TypeSpecSig *)local_1f0);
        writer::push_generic_params
                  ((writer *)
                   &signature.m_generic_args.
                    super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(GenericTypeInstSig *)w);
        writer::generic_param_guard::operator=
                  (&local_158,
                   (generic_param_guard *)
                   &signature.m_generic_args.
                    super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        writer::generic_param_guard::~generic_param_guard
                  ((generic_param_guard *)
                   &signature.m_generic_args.
                    super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pGVar7 = winmd::reader::TypeSpecSig::GenericTypeInst((TypeSpecSig *)local_1f0);
        winmd::reader::GenericTypeInstSig::GenericTypeInstSig
                  ((GenericTypeInstSig *)local_2c8,pGVar7);
        cVar9 = winmd::reader::GenericTypeInstSig::GenericType((GenericTypeInstSig *)local_2c8);
        local_2f8 = cVar9.super_typed_index<winmd::reader::TypeDefOrRef>.
                    super_index_base<winmd::reader::TypeDefOrRef>.m_table;
        local_2f0 = cVar9.super_typed_index<winmd::reader::TypeDefOrRef>.
                    super_index_base<winmd::reader::TypeDefOrRef>.m_value;
        local_2e8.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_table = local_2f8;
        local_2e8.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_value = local_2f0;
        TVar13 = winmd::reader::find_required(&local_2e8);
        local_308 = TVar13.super_row_base<winmd::reader::TypeDef>.m_table;
        local_300 = TVar13.super_row_base<winmd::reader::TypeDef>.m_index;
        local_12c = 4;
        local_2d8 = local_308;
        local_2d0 = local_300;
        type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>._8_8_ = local_308;
        info.type.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ = local_300;
        winmd::reader::GenericTypeInstSig::~GenericTypeInstSig((GenericTypeInstSig *)local_2c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range4);
        winmd::reader::TypeSpecSig::~TypeSpecSig((TypeSpecSig *)local_1f0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_318,"Windows.Foundation.Metadata");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_328,"ExclusiveToAttribute");
      info.type.super_row_base<winmd::reader::TypeDef>._12_1_ =
           has_attribute<winmd::reader::TypeDef>
                     ((TypeDef *)
                      &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                       super_index_base<winmd::reader::TypeDefOrRef>.m_value,&local_318,&local_328);
      bVar2 = info.type.super_row_base<winmd::reader::TypeDef>.m_index._2_1_;
      bVar1 = info.type.super_row_base<winmd::reader::TypeDef>.m_index._1_1_;
      winmd::reader::TypeDef::InterfaceImpl
                (&local_348,
                 (TypeDef *)
                 &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                  super_index_base<winmd::reader::TypeDefOrRef>.m_value);
      get_interfaces_impl(w,result,(bool)(bVar1 & 1),(bool)(bVar2 & 1),base,
                          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&info.relative_version,&local_348);
      sVar10 = (string_view)
               ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
      local_358 = sVar10;
      insert_or_assign(result,&local_358,
                       (interface_info *)
                       &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                        super_index_base<winmd::reader::TypeDefOrRef>.m_value);
      writer::generic_param_guard::~generic_param_guard(&local_158);
      local_12c = 0;
    }
    else {
      local_12c = 3;
    }
    ::std::__cxx11::string::~string((string *)local_e0);
    interface_info::~interface_info
              ((interface_info *)
               &type.super_typed_index<winmd::reader::TypeDefOrRef>.
                super_index_base<winmd::reader::TypeDefOrRef>.m_value);
    winmd::reader::row_base<winmd::reader::InterfaceImpl>::operator++
              ((row_base<winmd::reader::InterfaceImpl> *)
               &__end1.super_row_base<winmd::reader::InterfaceImpl>.m_index);
  }
  return;
}

Assistant:

static void get_interfaces_impl(writer& w, get_interfaces_t& result, bool defaulted, bool overridable, bool base, std::vector<std::vector<std::string>> const& generic_param_stack, std::pair<InterfaceImpl, InterfaceImpl>&& children)
    {
        for (auto&& impl : children)
        {
            interface_info info;
            auto type = impl.Interface();
            auto name = w.write_temp("%", type);
            info.is_default = has_attribute(impl, "Windows.Foundation.Metadata", "DefaultAttribute");
            info.defaulted = !base && (defaulted || info.is_default);

            {
                // This is for correctness rather than an optimization (but helps performance as well).
                // If the interface was not previously inserted, carry on and recursively insert it.
                // If a previous insertion was defaulted we're done as it is correctly captured.
                // If a newly discovered instance of a previous insertion is not defaulted, we're also done.
                // If it was previously captured as non-defaulted but now found as defaulted, we carry on and
                // rediscover it as we need it to be defaulted recursively.

                if (auto found = find(result, name))
                {
                    if (found->defaulted || !info.defaulted)
                    {
                        continue;
                    }
                }
            }

            info.overridable = overridable || has_attribute(impl, "Windows.Foundation.Metadata", "OverridableAttribute");
            info.base = base;
            info.generic_param_stack = generic_param_stack;
            writer::generic_param_guard guard;

            switch (type.type())
            {
                case TypeDefOrRef::TypeDef:
                {
                    info.type = type.TypeDef();
                    break;
                }
                case TypeDefOrRef::TypeRef:
                {
                    info.type = find_required(type.TypeRef());
                    w.add_depends(info.type);
                    break;
                }
                case TypeDefOrRef::TypeSpec:
                {
                    auto type_signature = type.TypeSpec().Signature();

                    std::vector<std::string> names;

                    for (auto&& arg : type_signature.GenericTypeInst().GenericArgs())
                    {
                        names.push_back(w.write_temp("%", arg));
                    }

                    info.generic_param_stack.push_back(std::move(names));

                    guard = w.push_generic_params(type_signature.GenericTypeInst());
                    auto signature = type_signature.GenericTypeInst();
                    info.type = find_required(signature.GenericType());

                    break;
                }
            }

            info.exclusive = has_attribute(info.type, "Windows.Foundation.Metadata", "ExclusiveToAttribute");
            get_interfaces_impl(w, result, info.defaulted, info.overridable, base, info.generic_param_stack, info.type.InterfaceImpl());
            insert_or_assign(result, name, std::move(info));
        }
    }